

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmwCmpxchg<unsigned_int,unsigned_short>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  pointer puVar1;
  Store *this_00;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  RunResult RVar6;
  ulong uVar7;
  bool bVar8;
  Value VVar9;
  Value VVar10;
  Value VVar11;
  RefPtr<wabt::interp::Memory> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_88,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar9 = Pop(this);
  VVar10 = Pop(this);
  VVar11 = Pop(this);
  uVar4 = (ulong)instr.field_2.imm_u32x2.snd;
  uVar3 = VVar11.i32_;
  uVar5 = (ulong)uVar3;
  uVar7 = uVar5 + uVar4 + 2;
  puVar1 = ((local_88.obj_)->data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = uVar7 <= (ulong)((long)((local_88.obj_)->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar2);
  bVar8 = (instr.field_2.imm_u32x2.snd + uVar3 & 1) != 0;
  if (!bVar8 && bVar2) {
    uVar7 = (ulong)*(ushort *)(puVar1 + uVar4 + uVar5);
  }
  if ((short)uVar7 == VVar10._0_2_ && (!bVar8 && bVar2)) {
    *(short *)(puVar1 + uVar4 + uVar5) = VVar9._0_2_;
  }
  if (bVar8 || !bVar2) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_(&local_68,"invalid atomic access at %u+%u",(ulong)uVar3);
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    RVar6 = Trap;
  }
  else {
    VVar9._0_8_ = uVar7 & 0xffff;
    VVar9._8_4_ = uVar3;
    VVar9._12_4_ = 0;
    Push(this,VVar9);
    RVar6 = Ok;
  }
  if (local_88.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_88.store_)->roots_,local_88.root_index_);
  }
  return RVar6;
}

Assistant:

RunResult Thread::DoAtomicRmwCmpxchg(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V replace = static_cast<V>(Pop<T>());
  V expect = static_cast<V>(Pop<T>());
  V old;
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->AtomicRmwCmpxchg(offset, instr.imm_u32x2.snd, expect,
                                          replace, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(old));
  return RunResult::Ok;
}